

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

int __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
::size(FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
       *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = (((this->left_->fadexpr_).right_)->dx_).num_elts;
  iVar2 = (((this->right_->fadexpr_).left_)->dx_).num_elts;
  iVar3 = (((this->right_->fadexpr_).right_)->dx_).num_elts;
  if (iVar3 < iVar2) {
    iVar3 = iVar2;
  }
  if (iVar3 < iVar1) {
    iVar3 = iVar1;
  }
  return iVar3;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }